

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_CompSt(ast *node)

{
  ast *in_RDI;
  
  child(in_RDI,2);
  TR_DefList(node);
  child(in_RDI,3);
  TR_StmtList(node);
  return;
}

Assistant:

static void TR_CompSt(ast *node) {
    TR_DefList(child(node, 2));
    TR_StmtList(child(node, 3));
}